

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

ssize_t decode_length(uint32_t *res,size_t *shift_ptr,int *fin,uint32_t initial,size_t shift,
                     uint8_t *in,uint8_t *last,size_t prefix)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint32_t add;
  uint8_t *start;
  uint32_t n;
  uint32_t k;
  uint8_t *in_local;
  size_t shift_local;
  uint32_t initial_local;
  int *fin_local;
  size_t *shift_ptr_local;
  uint32_t *res_local;
  
  uVar2 = (1 << ((byte)prefix & 0x1f)) - 1U & 0xff;
  *shift_ptr = 0;
  *fin = 0;
  start._0_4_ = initial;
  _n = in;
  in_local = (uint8_t *)shift;
  if (initial == 0) {
    if ((*in & uVar2) != uVar2) {
      *res = *in & uVar2;
      *fin = 1;
      return 1;
    }
    _n = in + 1;
    start._0_4_ = uVar2;
    if (_n == last) {
      *res = uVar2;
      return (ssize_t)(_n + -(long)in);
    }
  }
  for (; _n != last; _n = _n + 1) {
    if ((uint8_t *)0x1f < in_local) {
      return -1;
    }
    if (0xffffffffU >> ((byte)in_local & 0x1f) < (*_n & 0x7f)) {
      return -1;
    }
    iVar3 = (*_n & 0x7f) << ((byte)in_local & 0x1f);
    if (-iVar3 - 1U < (uint32_t)start) {
      return -1;
    }
    start._0_4_ = iVar3 + (uint32_t)start;
    if ((*_n & 0x80) == 0) break;
    in_local = in_local + 7;
  }
  *shift_ptr = (size_t)in_local;
  if (_n == last) {
    *res = (uint32_t)start;
    lVar1 = -(long)in;
  }
  else {
    *res = (uint32_t)start;
    *fin = 1;
    lVar1 = 1 - (long)in;
  }
  res_local = (uint32_t *)(_n + lVar1);
  return (ssize_t)res_local;
}

Assistant:

static ssize_t decode_length(uint32_t *res, size_t *shift_ptr, int *fin,
                             uint32_t initial, size_t shift, const uint8_t *in,
                             const uint8_t *last, size_t prefix) {
  uint32_t k = (uint8_t)((1 << prefix) - 1);
  uint32_t n = initial;
  const uint8_t *start = in;

  *shift_ptr = 0;
  *fin = 0;

  if (n == 0) {
    if ((*in & k) != k) {
      *res = (*in) & k;
      *fin = 1;
      return 1;
    }

    n = k;

    if (++in == last) {
      *res = n;
      return (ssize_t)(in - start);
    }
  }

  for (; in != last; ++in, shift += 7) {
    uint32_t add = *in & 0x7f;

    if (shift >= 32) {
      DEBUGF("inflate: shift exponent overflow\n");
      return -1;
    }

    if ((UINT32_MAX >> shift) < add) {
      DEBUGF("inflate: integer overflow on shift\n");
      return -1;
    }

    add <<= shift;

    if (UINT32_MAX - add < n) {
      DEBUGF("inflate: integer overflow on addition\n");
      return -1;
    }

    n += add;

    if ((*in & (1 << 7)) == 0) {
      break;
    }
  }

  *shift_ptr = shift;

  if (in == last) {
    *res = n;
    return (ssize_t)(in - start);
  }

  *res = n;
  *fin = 1;
  return (ssize_t)(in + 1 - start);
}